

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O0

void __thiscall
Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>::Perfect
          (Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *this,FuncTerm *elem)

{
  Option<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_> *in_RSI;
  Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *in_RDI;
  Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> *this_00;
  anon_class_8_1_898b388d f;
  FuncTerm **in_stack_ffffffffffffffa0;
  Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  *in_stack_ffffffffffffffa8;
  Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> local_40;
  undefined1 local_38 [56];
  
  this_00 = &local_40;
  Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  ::tryGet(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  f.elem = (FuncTerm *)local_38;
  Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>::toOwned(this_00);
  Option<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>>::
  unwrapOrElse<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::unwrapOrElse(Kernel::FuncTerm)::_lambda()_1_>
            (in_RSI,f);
  Perfect(in_RDI,(Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *)(local_38 + 0x18));
  Option<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_>::~Option
            ((Option<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_> *)0x74d3d3);
  return;
}

Assistant:

explicit Perfect(T elem) 
    : Perfect(_ids.tryGet(&elem).toOwned()
        .unwrapOrElse([&](){
            auto entry = Perfect(_ids.size(),  new T(std::move(elem)));
            _ids.insert(entry._ptr, entry);
            DEBUG(*elemPtr, " -> ", T::className(),"#",entry._id);
            return entry;
          })) 
    { }